

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

string * highsBoolToString_abi_cxx11_(bool b,HighsInt field_width)

{
  char *pcVar1;
  int in_EDX;
  byte in_SIL;
  string *in_RDI;
  HighsInt abs_field_width;
  char *local_80;
  char *local_68;
  char *local_40;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_14 = in_EDX;
  if (in_EDX < 1) {
    local_14 = -in_EDX;
  }
  if (local_14 < 2) {
    if (local_9 == 0) {
      local_40 = "F";
    }
    else {
      local_40 = "T";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_40,&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 < 3) {
    pcVar1 = "false";
    if (local_9 != 0) {
      pcVar1 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_EDX < 0) {
    if (local_9 == 0) {
      local_68 = "false";
    }
    else {
      local_68 = "true ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_68,&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    if (local_9 == 0) {
      local_80 = "false";
    }
    else {
      local_80 = " true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_80,&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  return in_RDI;
}

Assistant:

const std::string highsBoolToString(const bool b, const HighsInt field_width) {
  const HighsInt abs_field_width = std::abs(field_width);
  if (abs_field_width <= 1) return b ? "T" : "F";
  if (abs_field_width <= 2) return b ? "true" : "false";
  if (field_width < 0) return b ? "true " : "false";
  return b ? " true" : "false";
}